

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void QHashPrivate::MultiNode<QByteArray,_QByteArray>::createInPlace<QByteArray>
               (MultiNode<QByteArray,_QByteArray> *n,QByteArray *k,QByteArray *args)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  Chain *pCVar4;
  
  pCVar4 = (Chain *)operator_new(0x20);
  pDVar2 = (args->d).d;
  pcVar3 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char *)0x0;
  (pCVar4->value).d.d = pDVar2;
  (pCVar4->value).d.ptr = pcVar3;
  qVar1 = (args->d).size;
  (args->d).size = 0;
  (pCVar4->value).d.size = qVar1;
  pCVar4->next = (MultiNodeChain<QByteArray> *)0x0;
  pDVar2 = (k->d).d;
  (k->d).d = (Data *)0x0;
  (n->key).d.d = pDVar2;
  pcVar3 = (k->d).ptr;
  (k->d).ptr = (char *)0x0;
  (n->key).d.ptr = pcVar3;
  qVar1 = (k->d).size;
  (k->d).size = 0;
  (n->key).d.size = qVar1;
  n->value = pCVar4;
  return;
}

Assistant:

static void createInPlace(MultiNode *n, Key &&k, Args &&... args)
    { new (n) MultiNode(std::move(k), new Chain{ T(std::forward<Args>(args)...), nullptr }); }